

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InvocationInterlockPlacementPass::removeBeginAndEndInstructionsFromFunction
          (InvocationInterlockPlacementPass *this,Function *func)

{
  anon_class_16_2_0e352904 local_50;
  function<void_(spvtools::opt::Instruction_*)> local_40;
  bool local_19;
  Function *pFStack_18;
  bool modified;
  Function *func_local;
  InvocationInterlockPlacementPass *this_local;
  
  local_19 = false;
  local_50.modified = &local_19;
  local_50.this = this;
  pFStack_18 = func;
  func_local = (Function *)this;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::InvocationInterlockPlacementPass::removeBeginAndEndInstructionsFromFunction(spvtools::opt::Function*)::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_40,&local_50);
  opt::Function::ForEachInst(func,&local_40,false,false);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_40);
  return (bool)(local_19 & 1);
}

Assistant:

bool InvocationInterlockPlacementPass::
    removeBeginAndEndInstructionsFromFunction(Function* func) {
  bool modified = false;
  func->ForEachInst([this, &modified](Instruction* inst) {
    switch (inst->opcode()) {
      case spv::Op::OpBeginInvocationInterlockEXT:
        context()->KillInst(inst);
        modified = true;
        break;
      case spv::Op::OpEndInvocationInterlockEXT:
        context()->KillInst(inst);
        modified = true;
        break;
      default:
        break;
    }
  });
  return modified;
}